

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O1

void __thiscall QWidgetLineControl::setValidator(QWidgetLineControl *this,QValidator *v)

{
  int *piVar1;
  undefined8 uVar2;
  
  if (v == (QValidator *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)v);
  }
  piVar1 = *(int **)(this + 0xa8);
  *(undefined8 *)(this + 0xa8) = uVar2;
  *(QValidator **)(this + 0xb0) = v;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      operator_delete(piVar1);
      return;
    }
  }
  return;
}

Assistant:

void setValidator(const QValidator *v) { m_validator = const_cast<QValidator*>(v); }